

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store.c
# Opt level: O2

void load_store_io(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  byte bVar2;
  uint32_t uVar3;
  _func_void_uint32_t_uint32_t_access_type_t *UNRECOVERED_JUMPTABLE;
  uint uVar4;
  uint uVar5;
  
  uVar1 = thminstr->raw;
  uVar4 = ((uVar1 >> 6 & 0x1f) << (~(byte)(uVar1 >> 0xb) & 2)) +
          *(int *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar5 = state->r[uVar1 & 7];
    if ((uVar1 >> 0xc & 1) == 0) {
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Saving 0x%08X to 0x%08X\n",(ulong)uVar5,(ulong)uVar4);
      }
      UNRECOVERED_JUMPTABLE = state->write_word;
    }
    else {
      UNRECOVERED_JUMPTABLE = (_func_void_uint32_t_uint32_t_access_type_t *)state->write_byte;
      uVar5 = uVar5 & 0xff;
    }
    (*UNRECOVERED_JUMPTABLE)(uVar4,uVar5,ACCESS_NONSEQUENTIAL);
    return;
  }
  if ((uVar1 >> 0xc & 1) == 0) {
    uVar3 = (*state->read_word)(uVar4,ACCESS_NONSEQUENTIAL);
    uVar3 = arm_ror((status_register_t *)0x0,uVar3,(uVar4 & 3) << 3);
    uVar1 = thminstr->raw;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar3);
    }
    state->r[uVar1 & 7] = uVar3;
    return;
  }
  bVar2 = (*state->read_byte)(uVar4,ACCESS_NONSEQUENTIAL);
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)bVar2);
  }
  state->r[uVar1 & 7] = (uint)bVar2;
  (*state->cpu_idle)(1);
  return;
}

Assistant:

void load_store_io(arm7tdmi_t* state, thumbinstr_t * thminstr) {
    load_store_io_t* instr = &thminstr->LOAD_STORE_IO;
    word offset = instr->offset << (instr->b ? 0 : 2);
    word address = get_register(state, instr->rb) + offset;
    if (instr->l) {
        if (instr->b) {
            word value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
            set_register(state, instr->rd, value);
            state->cpu_idle(1);
        } else {
            word value = state->read_word(address, ACCESS_NONSEQUENTIAL);
            value = arm_ror(NULL, value, (address & 3u) << 3);
            set_register(state, instr->rd, value);
        }
    } else {
        word value = get_register(state, instr->rd);
        if (instr->b) {
            byte bytevalue = value & 0xFF;
            state->write_byte(address, bytevalue, ACCESS_NONSEQUENTIAL);
        } else {
            logdebug("Saving 0x%08X to 0x%08X", value, address);
            state->write_word(address, value, ACCESS_NONSEQUENTIAL);
        }
    }
}